

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

ConditionalDirectiveExpressionSyntax * __thiscall
slang::parsing::Preprocessor::parseConditionalExprTop(Preprocessor *this)

{
  LanguageVersion LVar1;
  NamedConditionalDirectiveExpressionSyntax *this_00;
  Diagnostic *this_01;
  char *pcVar2;
  size_t sVar3;
  Token TVar4;
  SourceRange range;
  string_view arg;
  Token id;
  Token local_20;
  
  this->inIfDefCondition = true;
  if ((this->currentToken).info == (Info *)0x0) {
    TVar4 = nextProcessed(this);
    this->currentToken = TVar4;
  }
  if ((this->currentToken).kind == OpenParenthesis) {
    this_00 = (NamedConditionalDirectiveExpressionSyntax *)parseConditionalExpr(this);
    if ((int)(this->options).languageVersion < 1) {
      range = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
      this_01 = Diagnostics::add(this->diagnostics,(DiagCode)0x20001,range);
      LVar1 = (this->options).languageVersion;
      sVar3 = 9;
      if (LVar1 == Default) {
        pcVar2 = "1800-2017";
      }
      else if (LVar1 == v1800_2023) {
        pcVar2 = "1800-2023";
      }
      else {
        pcVar2 = "";
        sVar3 = 0;
      }
      arg._M_str = pcVar2;
      arg._M_len = sVar3;
      Diagnostic::operator<<(this_01,arg);
    }
  }
  else {
    local_20 = expect(this,Identifier);
    this_00 = BumpAllocator::
              emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::parsing::Token&>
                        (this->alloc,&local_20);
  }
  this->inIfDefCondition = false;
  return &this_00->super_ConditionalDirectiveExpressionSyntax;
}

Assistant:

ConditionalDirectiveExpressionSyntax& Preprocessor::parseConditionalExprTop() {
    SLANG_ASSERT(!inIfDefCondition);
    auto guard = ScopeGuard([this] { inIfDefCondition = false; });
    inIfDefCondition = true;

    if (peek(TokenKind::OpenParenthesis)) {
        auto result = parseConditionalExpr();
        if (options.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, result->sourceRange())
                << toString(options.languageVersion);
        }
        return *result;
    }

    auto id = expect(TokenKind::Identifier);
    return *alloc.emplace<NamedConditionalDirectiveExpressionSyntax>(id);
}